

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Reshape_x86::forward
          (Reshape_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  Mat *src;
  int *piVar3;
  Allocator *pAVar4;
  void *pvVar5;
  size_t sVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined8 uVar23;
  bool bVar24;
  undefined8 uVar25;
  Option *pOVar26;
  int iVar27;
  uint uVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  byte bVar37;
  long lVar38;
  long lVar39;
  Mat *dst;
  int iVar40;
  ulong uVar41;
  size_t sVar42;
  undefined8 *puVar43;
  undefined8 *puVar44;
  int outh;
  int outw;
  int local_110;
  int outc;
  ulong local_108;
  int outd;
  int local_f8;
  uint local_f4;
  ulong local_f0;
  Mat local_e8;
  ulong local_a0;
  Option *local_98;
  ulong local_90;
  Mat *local_88;
  Mat *local_80;
  Option opt_flatten;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  dst = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  outw = (this->super_Reshape).w;
  outh = (this->super_Reshape).h;
  outd = (this->super_Reshape).d;
  outc = (this->super_Reshape).c;
  if (((this->super_Reshape).shape_expr._M_string_length != 0) &&
     (iVar27 = Reshape::eval_shape_expr(&this->super_Reshape,bottom_blobs,&outw,&outh,&outd,&outc),
     iVar27 != 0)) {
    return -1;
  }
  iVar27 = (this->super_Reshape).ndim;
  if (iVar27 == 1) {
    flatten(src,dst,opt);
    if ((dst->data != (void *)0x0) && ((long)dst->c * dst->cstep != 0)) {
      return 0;
    }
    return -100;
  }
  uVar28 = src->dims;
  local_108 = (ulong)uVar28;
  local_f4 = src->elempack;
  uVar41 = (ulong)(int)local_f4;
  local_90 = src->elemsize;
  uVar23._0_4_ = src->dims;
  uVar23._4_4_ = src->w;
  iVar40 = src->h;
  uVar25._0_4_ = src->h;
  uVar25._4_4_ = src->d;
  iVar32 = src->c;
  local_110 = iVar40 * src->d * src->w * local_f4 * iVar32;
  local_98 = opt;
  local_88 = dst;
  if (iVar27 == 2) {
    if (outw == 0) {
      uVar30 = 1;
      if (uVar28 == 1) {
        uVar30 = local_f4;
      }
      outw = uVar30 * src->w;
    }
    if (outh == 0) {
      uVar30 = 1;
      if (uVar28 == 2) {
        uVar30 = local_f4;
      }
      outh = uVar30 * iVar40;
    }
    if (outw == -1) {
      outw = local_110 / outh;
    }
    if (outh == -1) {
      outh = local_110 / outw;
    }
    bVar37 = (outh & 3U) == 0 & opt->use_packing_layout;
    sVar42 = local_90 / uVar41 << bVar37 * '\x02';
    local_a0 = uVar41;
    if (((uVar28 == 2) && (iVar40 * local_f4 == outh)) &&
       (local_f4 == (uint)bVar37 + (uint)bVar37 * 2 + 1)) {
      if (dst != src) {
        piVar3 = src->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = dst->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pAVar4 = dst->allocator;
            if (pAVar4 == (Allocator *)0x0) {
              free(dst->data);
            }
            else {
              (*pAVar4->_vptr_Allocator[3])(pAVar4,dst->data,local_90 % uVar41);
            }
          }
        }
        dst->cstep = 0;
        dst->data = (void *)0x0;
        dst->refcount = (int *)0x0;
        *(undefined8 *)((long)&dst->refcount + 4) = 0;
        *(undefined8 *)((long)&dst->elemsize + 4) = 0;
        dst->c = 0;
        dst->dims = 0;
        dst->w = 0;
        dst->h = 0;
        dst->d = 0;
        piVar3 = src->refcount;
        dst->data = src->data;
        dst->refcount = piVar3;
        dst->elemsize = src->elemsize;
        dst->elempack = src->elempack;
        dst->allocator = src->allocator;
        iVar27 = src->w;
        iVar40 = src->h;
        iVar32 = src->d;
        dst->dims = src->dims;
        dst->w = iVar27;
        dst->h = iVar40;
        dst->d = iVar32;
        dst->c = src->c;
        dst->cstep = src->cstep;
        return 0;
      }
      return 0;
    }
    if (bVar37 == 0) {
      flatten(src,dst,opt);
      if (dst->data == (void *)0x0) {
        return -100;
      }
      if ((long)dst->c * dst->cstep != 0) {
        dst->dims = 2;
        dst->w = outw;
        dst->h = outh;
        dst->cstep = (long)outh * (long)outw;
        dst->elemsize = sVar42;
        dst->elempack = 1;
        return 0;
      }
      return -100;
    }
    local_e8.data = src->data;
    local_e8.refcount = src->refcount;
    local_e8.allocator = src->allocator;
    local_e8.cstep = src->cstep;
    if (local_e8.refcount != (int *)0x0) {
      LOCK();
      *local_e8.refcount = *local_e8.refcount + 1;
      UNLOCK();
    }
    opt_flatten.lightmode = opt->lightmode;
    opt_flatten.use_shader_pack8 = opt->use_shader_pack8;
    opt_flatten.use_subgroup_ops = opt->use_subgroup_ops;
    opt_flatten.use_reserved_0 = opt->use_reserved_0;
    opt_flatten.num_threads = opt->num_threads;
    opt_flatten.workspace_allocator = opt->workspace_allocator;
    opt_flatten.openmp_blocktime = opt->openmp_blocktime;
    opt_flatten.use_winograd_convolution = opt->use_winograd_convolution;
    opt_flatten.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_flatten.use_int8_inference = opt->use_int8_inference;
    opt_flatten.use_vulkan_compute = opt->use_vulkan_compute;
    opt_flatten.use_bf16_storage = opt->use_bf16_storage;
    opt_flatten.use_fp16_packed = opt->use_fp16_packed;
    opt_flatten.use_fp16_storage = opt->use_fp16_storage;
    opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_flatten.use_int8_packed = opt->use_int8_packed;
    opt_flatten.use_int8_storage = opt->use_int8_storage;
    opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_flatten.use_packing_layout = opt->use_packing_layout;
    opt_flatten.vulkan_device_index = opt->vulkan_device_index;
    opt_flatten.use_reserved_1 = opt->use_reserved_1;
    opt_flatten.use_image_storage = opt->use_image_storage;
    opt_flatten.use_tensor_storage = opt->use_tensor_storage;
    opt_flatten.use_reserved_2 = opt->use_reserved_2;
    opt_flatten.flush_denormals = opt->flush_denormals;
    opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_flatten.use_shader_local_memory = opt->use_shader_local_memory;
    opt_flatten.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_flatten.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_flatten.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_flatten.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_flatten.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_flatten.use_fp16_uniform = opt->use_fp16_uniform;
    opt_flatten.use_int8_uniform = opt->use_int8_uniform;
    opt_flatten.use_reserved_9 = opt->use_reserved_9;
    opt_flatten.use_reserved_10 = opt->use_reserved_10;
    opt_flatten.use_reserved_11 = opt->use_reserved_11;
    opt_flatten.blob_allocator = opt->workspace_allocator;
    local_e8.elemsize = local_90;
    local_e8.elempack = local_f4;
    local_e8._40_8_ = uVar23;
    local_e8._48_8_ = uVar25;
    local_e8.c = iVar32;
    flatten(src,&local_e8,&opt_flatten);
    if ((local_e8.data == (void *)0x0) || ((long)local_e8.c * local_e8.cstep == 0)) {
      iVar40 = -100;
      iVar27 = 0;
    }
    else {
      Mat::create(dst,outw,outh / 4,sVar42,4,opt->blob_allocator);
      iVar40 = -100;
      if (dst->data == (void *)0x0) {
        iVar27 = 0;
      }
      else {
        iVar27 = 0;
        if ((long)dst->c * dst->cstep != 0) {
          lVar29 = (long)outw;
          local_f8 = outw * 4;
          lVar33 = lVar29 * 0x10;
          lVar34 = lVar29 * 8;
          lVar36 = lVar29 << 2;
          lVar29 = lVar29 * 0xc;
          for (lVar38 = 0; lVar31 = lVar29, lVar38 < dst->h; lVar38 = lVar38 + 1) {
            lVar39 = dst->elemsize * lVar38 * (long)dst->w;
            pvVar5 = dst->data;
            lVar29 = 0;
            for (iVar40 = 0; iVar40 + 3 < outw; iVar40 = iVar40 + 4) {
              puVar1 = (undefined4 *)((long)local_e8.data + lVar29 + (long)iVar27 * 4);
              uVar8 = puVar1[1];
              uVar9 = puVar1[2];
              uVar10 = puVar1[3];
              puVar2 = (undefined4 *)((long)local_e8.data + lVar29 + lVar36);
              uVar11 = *puVar2;
              uVar12 = puVar2[1];
              uVar13 = puVar2[2];
              uVar14 = puVar2[3];
              puVar2 = (undefined4 *)((long)local_e8.data + lVar29 + lVar34);
              uVar15 = *puVar2;
              uVar16 = puVar2[1];
              uVar17 = puVar2[2];
              uVar18 = puVar2[3];
              puVar2 = (undefined4 *)((long)local_e8.data + lVar29 + lVar31);
              uVar19 = *puVar2;
              uVar20 = puVar2[1];
              uVar21 = puVar2[2];
              uVar22 = puVar2[3];
              puVar2 = (undefined4 *)((long)pvVar5 + lVar29 * 4 + lVar39);
              *puVar2 = *puVar1;
              puVar2[1] = uVar11;
              puVar2[2] = uVar15;
              puVar2[3] = uVar19;
              puVar1 = (undefined4 *)((long)pvVar5 + lVar29 * 4 + lVar39 + 0x10);
              *puVar1 = uVar8;
              puVar1[1] = uVar12;
              puVar1[2] = uVar16;
              puVar1[3] = uVar20;
              puVar1 = (undefined4 *)((long)pvVar5 + lVar29 * 4 + lVar39 + 0x20);
              *puVar1 = uVar9;
              puVar1[1] = uVar13;
              puVar1[2] = uVar17;
              puVar1[3] = uVar21;
              puVar1 = (undefined4 *)((long)pvVar5 + lVar29 * 4 + lVar39 + 0x30);
              *puVar1 = uVar10;
              puVar1[1] = uVar14;
              puVar1[2] = uVar18;
              puVar1[3] = uVar22;
              lVar29 = lVar29 + 0x10;
            }
            for (; iVar40 < outw; iVar40 = iVar40 + 1) {
              *(undefined4 *)((long)pvVar5 + lVar29 * 4 + lVar39) =
                   *(undefined4 *)((long)local_e8.data + lVar29 + (long)iVar27 * 4);
              *(undefined4 *)((long)pvVar5 + lVar29 * 4 + lVar39 + 4) =
                   *(undefined4 *)((long)local_e8.data + lVar29 + lVar36);
              *(undefined4 *)((long)pvVar5 + lVar29 * 4 + lVar39 + 8) =
                   *(undefined4 *)((long)local_e8.data + lVar29 + lVar34);
              *(undefined4 *)((long)pvVar5 + lVar29 * 4 + lVar39 + 0xc) =
                   *(undefined4 *)((long)local_e8.data + lVar29 + lVar31);
              lVar29 = lVar29 + 4;
            }
            lVar34 = lVar34 + lVar33;
            lVar36 = lVar36 + lVar33;
            iVar27 = iVar27 + local_f8;
            dst = local_88;
            lVar29 = lVar31 + lVar33;
            local_f0 = lVar31;
          }
          iVar27 = 1;
          iVar40 = -1;
          local_80 = src;
        }
      }
    }
    uVar41 = local_a0;
    if (local_e8.refcount != (int *)0x0) {
      LOCK();
      *local_e8.refcount = *local_e8.refcount + -1;
      UNLOCK();
      if (*local_e8.refcount == 0) {
        if (local_e8.allocator == (Allocator *)0x0) {
          free(local_e8.data);
        }
        else {
          (*(local_e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if ((char)iVar27 == '\0') {
      return iVar40;
    }
    iVar27 = (this->super_Reshape).ndim;
  }
  else {
    iVar40 = -1;
  }
  pOVar26 = local_98;
  if (1 < iVar27 - 3U) {
    return 0;
  }
  if (iVar27 == 3) {
    if (outw == 0) {
      uVar28 = 1;
      if ((int)local_108 == 1) {
        uVar28 = local_f4;
      }
      outw = uVar28 * src->w;
    }
    if (outh == 0) {
      uVar28 = 1;
      if ((int)local_108 == 2) {
        uVar28 = local_f4;
      }
      outh = uVar28 * src->h;
    }
    if (outc == 0) {
      uVar28 = 1;
      if ((int)local_108 == 3) {
        uVar28 = local_f4;
      }
      outc = uVar28 * src->c;
    }
    uVar35 = (ulong)(uint)outc;
    if (outw == -1) {
      outw = (int)((long)((ulong)(uint)((int)((long)local_110 / (long)outc) >> 0x1f) << 0x20 |
                         (long)local_110 / (long)outc & 0xffffffffU) / (long)outh);
    }
    if (outh == -1) {
      outh = (int)((long)((ulong)(uint)((int)((long)local_110 / (long)outc) >> 0x1f) << 0x20 |
                         (long)local_110 / (long)outc & 0xffffffffU) / (long)outw);
    }
    if (outc == -1) {
      uVar35 = (long)((ulong)(uint)((int)((long)local_110 / (long)outh) >> 0x1f) << 0x20 |
                     (long)local_110 / (long)outh & 0xffffffffU) / (long)outw;
      outc = (int)uVar35;
      uVar35 = uVar35 & 0xffffffff;
    }
    outd = 1;
  }
  else {
    uVar28 = 1;
    if (outw == 0) {
      uVar30 = uVar28;
      if ((int)local_108 == 1) {
        uVar30 = local_f4;
      }
      outw = uVar30 * src->w;
    }
    if (outh == 0) {
      uVar30 = uVar28;
      if ((int)local_108 == 2) {
        uVar30 = local_f4;
      }
      outh = uVar30 * src->h;
    }
    if (outd == 0) {
      outd = src->d;
    }
    if (outc == 0) {
      if ((int)local_108 - 3U < 2) {
        uVar28 = local_f4;
      }
      outc = uVar28 * src->c;
    }
    uVar35 = (ulong)(uint)outc;
    if (outw == -1) {
      uVar7 = (long)((ulong)(uint)((int)((long)local_110 / (long)outc) >> 0x1f) << 0x20 |
                    (long)local_110 / (long)outc & 0xffffffffU) / (long)outd;
      outw = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                  (long)outh);
    }
    if (outh == -1) {
      uVar7 = (long)((ulong)(uint)((int)((long)local_110 / (long)outc) >> 0x1f) << 0x20 |
                    (long)local_110 / (long)outc & 0xffffffffU) / (long)outd;
      outh = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                  (long)outw);
    }
    if (outd == -1) {
      uVar7 = (long)((ulong)(uint)((int)((long)local_110 / (long)outc) >> 0x1f) << 0x20 |
                    (long)local_110 / (long)outc & 0xffffffffU) / (long)outh;
      outd = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                  (long)outw);
    }
    if (outc == -1) {
      uVar35 = (long)((ulong)(uint)((int)((long)local_110 / (long)outd) >> 0x1f) << 0x20 |
                     (long)local_110 / (long)outd & 0xffffffffU) / (long)outh;
      uVar35 = (long)((ulong)(uint)((int)uVar35 >> 0x1f) << 0x20 | uVar35 & 0xffffffff) / (long)outw
      ;
      outc = (int)uVar35;
      uVar35 = uVar35 & 0xffffffff;
    }
  }
  bVar37 = (uVar35 & 3) == 0 & local_98->use_packing_layout;
  uVar28 = (uint)bVar37 + (uint)bVar37 * 2 + 1;
  local_f0 = (ulong)uVar28;
  sVar42 = local_90 / uVar41 << bVar37 * '\x02';
  iVar32 = src->c;
  local_f8 = iVar40;
  if ((((int)local_108 - 3U < 2) && (iVar32 * local_f4 == (int)uVar35)) && (local_f4 == uVar28)) {
    if (dst != src) {
      piVar3 = src->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = dst->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pAVar4 = dst->allocator;
          if (pAVar4 == (Allocator *)0x0) {
            free(dst->data);
          }
          else {
            (*pAVar4->_vptr_Allocator[3])(pAVar4,dst->data,local_90 % uVar41);
          }
        }
      }
      dst->cstep = 0;
      dst->data = (void *)0x0;
      dst->refcount = (int *)0x0;
      *(undefined8 *)((long)&dst->refcount + 4) = 0;
      *(undefined8 *)((long)&dst->elemsize + 4) = 0;
      dst->c = 0;
      dst->dims = 0;
      dst->w = 0;
      dst->h = 0;
      dst->d = 0;
      piVar3 = src->refcount;
      dst->data = src->data;
      dst->refcount = piVar3;
      dst->elemsize = src->elemsize;
      dst->elempack = src->elempack;
      dst->allocator = src->allocator;
      iVar27 = src->w;
      iVar40 = src->h;
      iVar32 = src->d;
      dst->dims = src->dims;
      dst->w = iVar27;
      dst->h = iVar40;
      dst->d = iVar32;
      dst->c = src->c;
      dst->cstep = src->cstep;
      iVar27 = (this->super_Reshape).ndim;
    }
    dst->dims = iVar27;
    dst->w = outw;
    dst->h = outh;
    dst->d = outd;
    return 0;
  }
  local_108 = CONCAT71(local_108._1_7_,bVar37);
  local_e8.data = src->data;
  local_e8.refcount = src->refcount;
  local_e8.elemsize = src->elemsize;
  local_e8.elempack = src->elempack;
  local_e8.allocator = src->allocator;
  local_e8.dims = src->dims;
  local_e8.w = src->w;
  local_e8.h = src->h;
  local_e8.d = src->d;
  local_e8.cstep = src->cstep;
  if (local_e8.refcount != (int *)0x0) {
    LOCK();
    *local_e8.refcount = *local_e8.refcount + 1;
    UNLOCK();
  }
  opt_flatten.lightmode = local_98->lightmode;
  opt_flatten.use_shader_pack8 = local_98->use_shader_pack8;
  opt_flatten.use_subgroup_ops = local_98->use_subgroup_ops;
  opt_flatten.use_reserved_0 = local_98->use_reserved_0;
  opt_flatten.num_threads = local_98->num_threads;
  opt_flatten.workspace_allocator = local_98->workspace_allocator;
  opt_flatten.openmp_blocktime = local_98->openmp_blocktime;
  opt_flatten.use_winograd_convolution = local_98->use_winograd_convolution;
  opt_flatten.use_sgemm_convolution = local_98->use_sgemm_convolution;
  opt_flatten.use_int8_inference = local_98->use_int8_inference;
  opt_flatten.use_vulkan_compute = local_98->use_vulkan_compute;
  opt_flatten.use_bf16_storage = local_98->use_bf16_storage;
  opt_flatten.use_fp16_packed = local_98->use_fp16_packed;
  opt_flatten.use_fp16_storage = local_98->use_fp16_storage;
  opt_flatten.use_fp16_arithmetic = local_98->use_fp16_arithmetic;
  opt_flatten.use_int8_packed = local_98->use_int8_packed;
  opt_flatten.use_int8_storage = local_98->use_int8_storage;
  opt_flatten.use_int8_arithmetic = local_98->use_int8_arithmetic;
  opt_flatten.use_packing_layout = local_98->use_packing_layout;
  opt_flatten.vulkan_device_index = local_98->vulkan_device_index;
  opt_flatten.use_reserved_1 = local_98->use_reserved_1;
  opt_flatten.use_image_storage = local_98->use_image_storage;
  opt_flatten.use_tensor_storage = local_98->use_tensor_storage;
  opt_flatten.use_reserved_2 = local_98->use_reserved_2;
  opt_flatten.flush_denormals = local_98->flush_denormals;
  opt_flatten.use_local_pool_allocator = local_98->use_local_pool_allocator;
  opt_flatten.use_shader_local_memory = local_98->use_shader_local_memory;
  opt_flatten.use_cooperative_matrix = local_98->use_cooperative_matrix;
  opt_flatten.use_winograd23_convolution = local_98->use_winograd23_convolution;
  opt_flatten.use_winograd43_convolution = local_98->use_winograd43_convolution;
  opt_flatten.use_winograd63_convolution = local_98->use_winograd63_convolution;
  opt_flatten.use_a53_a55_optimized_kernel = local_98->use_a53_a55_optimized_kernel;
  opt_flatten.use_fp16_uniform = local_98->use_fp16_uniform;
  opt_flatten.use_int8_uniform = local_98->use_int8_uniform;
  opt_flatten.use_reserved_9 = local_98->use_reserved_9;
  opt_flatten.use_reserved_10 = local_98->use_reserved_10;
  opt_flatten.use_reserved_11 = local_98->use_reserved_11;
  opt_flatten.blob_allocator = local_98->workspace_allocator;
  local_e8.c = iVar32;
  flatten(src,&local_e8,&opt_flatten);
  iVar27 = -100;
  if ((local_e8.data != (void *)0x0) && ((long)local_e8.c * local_e8.cstep != 0)) {
    iVar40 = (int)local_f0;
    if ((this->super_Reshape).ndim == 3) {
      Mat::create(dst,outw,outh,outc / iVar40,sVar42,iVar40,pOVar26->blob_allocator);
    }
    else {
      Mat::create(dst,outw,outh,outd,outc / iVar40,sVar42,iVar40,pOVar26->blob_allocator);
    }
    if ((dst->data != (void *)0x0) && (uVar41 = (ulong)dst->c, dst->cstep * uVar41 != 0)) {
      iVar27 = dst->h * dst->w * dst->d;
      if ((char)local_108 == '\0') {
        lVar34 = 0;
        for (lVar29 = 0; lVar29 < (int)uVar41; lVar29 = lVar29 + 1) {
          pvVar5 = dst->data;
          sVar42 = dst->elemsize;
          sVar6 = dst->cstep;
          puVar43 = (undefined8 *)(sVar6 * lVar29 * sVar42 + (long)pvVar5);
          puVar44 = (undefined8 *)((long)local_e8.data + lVar29 * iVar27 * 4);
          lVar33 = 0;
          for (iVar40 = 0; iVar40 + 3 < iVar27; iVar40 = iVar40 + 4) {
            uVar23 = puVar44[1];
            *puVar43 = *puVar44;
            puVar43[1] = uVar23;
            puVar44 = puVar44 + 2;
            puVar43 = puVar43 + 2;
            lVar33 = lVar33 + 4;
          }
          for (; (int)lVar33 < iVar27; lVar33 = lVar33 + 1) {
            *(undefined4 *)((long)pvVar5 + lVar33 * 4 + sVar6 * sVar42 * lVar29) =
                 *(undefined4 *)((long)local_e8.data + lVar33 * 4 + lVar34);
          }
          uVar41 = (ulong)(uint)local_88->c;
          lVar34 = lVar34 + (long)iVar27 * 4;
          dst = local_88;
        }
      }
      else {
        local_108 = CONCAT44(local_108._4_4_,iVar27 * 4);
        lVar29 = (long)iVar27;
        lVar34 = lVar29 * 4;
        lVar33 = lVar29 * 0x10;
        lVar36 = lVar29 * 0xc;
        lVar29 = lVar29 << 3;
        iVar40 = 0;
        for (lVar38 = 0; lVar38 < (int)uVar41; lVar38 = lVar38 + 1) {
          lVar39 = dst->elemsize * dst->cstep * lVar38;
          pvVar5 = dst->data;
          lVar31 = 0;
          for (iVar32 = 0; iVar32 + 3 < iVar27; iVar32 = iVar32 + 4) {
            puVar1 = (undefined4 *)((long)local_e8.data + lVar31 + (long)iVar40 * 4);
            uVar8 = puVar1[1];
            uVar9 = puVar1[2];
            uVar10 = puVar1[3];
            puVar2 = (undefined4 *)((long)local_e8.data + lVar31 + lVar34);
            uVar11 = *puVar2;
            uVar12 = puVar2[1];
            uVar13 = puVar2[2];
            uVar14 = puVar2[3];
            puVar2 = (undefined4 *)((long)local_e8.data + lVar31 + lVar29);
            uVar15 = *puVar2;
            uVar16 = puVar2[1];
            uVar17 = puVar2[2];
            uVar18 = puVar2[3];
            puVar2 = (undefined4 *)((long)local_e8.data + lVar31 + lVar36);
            uVar19 = *puVar2;
            uVar20 = puVar2[1];
            uVar21 = puVar2[2];
            uVar22 = puVar2[3];
            puVar2 = (undefined4 *)((long)pvVar5 + lVar31 * 4 + lVar39);
            *puVar2 = *puVar1;
            puVar2[1] = uVar11;
            puVar2[2] = uVar15;
            puVar2[3] = uVar19;
            puVar1 = (undefined4 *)((long)pvVar5 + lVar31 * 4 + lVar39 + 0x10);
            *puVar1 = uVar8;
            puVar1[1] = uVar12;
            puVar1[2] = uVar16;
            puVar1[3] = uVar20;
            puVar1 = (undefined4 *)((long)pvVar5 + lVar31 * 4 + lVar39 + 0x20);
            *puVar1 = uVar9;
            puVar1[1] = uVar13;
            puVar1[2] = uVar17;
            puVar1[3] = uVar21;
            puVar1 = (undefined4 *)((long)pvVar5 + lVar31 * 4 + lVar39 + 0x30);
            *puVar1 = uVar10;
            puVar1[1] = uVar14;
            puVar1[2] = uVar18;
            puVar1[3] = uVar22;
            lVar31 = lVar31 + 0x10;
          }
          for (; iVar32 < iVar27; iVar32 = iVar32 + 1) {
            *(undefined4 *)((long)pvVar5 + lVar31 * 4 + lVar39) =
                 *(undefined4 *)((long)local_e8.data + lVar31 + (long)iVar40 * 4);
            *(undefined4 *)((long)pvVar5 + lVar31 * 4 + lVar39 + 4) =
                 *(undefined4 *)((long)local_e8.data + lVar31 + lVar34);
            *(undefined4 *)((long)pvVar5 + lVar31 * 4 + lVar39 + 8) =
                 *(undefined4 *)((long)local_e8.data + lVar31 + lVar29);
            *(undefined4 *)((long)pvVar5 + lVar31 * 4 + lVar39 + 0xc) =
                 *(undefined4 *)((long)local_e8.data + lVar31 + lVar36);
            lVar31 = lVar31 + 4;
          }
          uVar41 = (ulong)(uint)local_88->c;
          iVar40 = iVar40 + iVar27 * 4;
          lVar34 = lVar34 + lVar33;
          lVar29 = lVar29 + lVar33;
          lVar36 = lVar36 + lVar33;
          dst = local_88;
        }
      }
      bVar24 = true;
      iVar27 = local_f8;
      goto LAB_002fee44;
    }
  }
  bVar24 = false;
LAB_002fee44:
  if (local_e8.refcount != (int *)0x0) {
    LOCK();
    *local_e8.refcount = *local_e8.refcount + -1;
    UNLOCK();
    if (*local_e8.refcount == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        free(local_e8.data);
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (bVar24) {
    return 0;
  }
  return iVar27;
}

Assistant:

int Reshape_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    Mat& top_blob = top_blobs[0];

    // resolve out shape
    int outw = w;
    int outh = h;
    int outd = d;
    int outc = c;

    if (!shape_expr.empty())
    {
        int er = eval_shape_expr(bottom_blobs, outw, outh, outd, outc);
        if (er != 0)
            return -1;
    }

    if (ndim == 1)
    {
        // flatten
        flatten(bottom_blob, top_blob, opt);
        if (top_blob.empty())
            return -100;

        return 0;
    }

    const int dims = bottom_blob.dims;
    const int elempack = bottom_blob.elempack;
    const size_t elemsize = bottom_blob.elemsize;

    const int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c * elempack;

    if (ndim == 2)
    {
        if (outw == 0)
            outw = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
        if (outh == 0)
            outh = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;

        if (outw == -1)
            outw = total / outh;
        if (outh == -1)
            outh = total / outw;

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 2 && bottom_blob.h * elempack == outh && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            return 0;
        }

        if (out_elempack == 1)
        {
            // flatten
            flatten(bottom_blob, top_blob, opt);
            if (top_blob.empty())
                return -100;

            top_blob.dims = 2;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.cstep = (size_t)outw * outh;
            top_blob.elemsize = out_elemsize;
            top_blob.elempack = out_elempack;

            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < top_blob.h; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 16;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 16 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 16 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 16 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + outw * (i * 16 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + outw * (i * 16 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + outw * (i * 16 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + outw * (i * 16 + 7);
                const float* ptr8 = (const float*)bottom_blob_flattened + outw * (i * 16 + 8);
                const float* ptr9 = (const float*)bottom_blob_flattened + outw * (i * 16 + 9);
                const float* ptra = (const float*)bottom_blob_flattened + outw * (i * 16 + 10);
                const float* ptrb = (const float*)bottom_blob_flattened + outw * (i * 16 + 11);
                const float* ptrc = (const float*)bottom_blob_flattened + outw * (i * 16 + 12);
                const float* ptrd = (const float*)bottom_blob_flattened + outw * (i * 16 + 13);
                const float* ptre = (const float*)bottom_blob_flattened + outw * (i * 16 + 14);
                const float* ptrf = (const float*)bottom_blob_flattened + outw * (i * 16 + 15);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 15 < outw; j += 16)
                {
                    __m512 _row0 = _mm512_loadu_ps(ptr0);
                    __m512 _row1 = _mm512_loadu_ps(ptr1);
                    __m512 _row2 = _mm512_loadu_ps(ptr2);
                    __m512 _row3 = _mm512_loadu_ps(ptr3);
                    __m512 _row4 = _mm512_loadu_ps(ptr4);
                    __m512 _row5 = _mm512_loadu_ps(ptr5);
                    __m512 _row6 = _mm512_loadu_ps(ptr6);
                    __m512 _row7 = _mm512_loadu_ps(ptr7);
                    __m512 _row8 = _mm512_loadu_ps(ptr8);
                    __m512 _row9 = _mm512_loadu_ps(ptr9);
                    __m512 _rowa = _mm512_loadu_ps(ptra);
                    __m512 _rowb = _mm512_loadu_ps(ptrb);
                    __m512 _rowc = _mm512_loadu_ps(ptrc);
                    __m512 _rowd = _mm512_loadu_ps(ptrd);
                    __m512 _rowe = _mm512_loadu_ps(ptre);
                    __m512 _rowf = _mm512_loadu_ps(ptrf);

                    transpose16x16_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7, _row8, _row9, _rowa, _rowb, _rowc, _rowd, _rowe, _rowf);

                    _mm512_storeu_ps(outptr, _row0);
                    _mm512_storeu_ps(outptr + 16, _row1);
                    _mm512_storeu_ps(outptr + 16 * 2, _row2);
                    _mm512_storeu_ps(outptr + 16 * 3, _row3);
                    _mm512_storeu_ps(outptr + 16 * 4, _row4);
                    _mm512_storeu_ps(outptr + 16 * 5, _row5);
                    _mm512_storeu_ps(outptr + 16 * 6, _row6);
                    _mm512_storeu_ps(outptr + 16 * 7, _row7);
                    _mm512_storeu_ps(outptr + 16 * 8, _row8);
                    _mm512_storeu_ps(outptr + 16 * 9, _row9);
                    _mm512_storeu_ps(outptr + 16 * 10, _rowa);
                    _mm512_storeu_ps(outptr + 16 * 11, _rowb);
                    _mm512_storeu_ps(outptr + 16 * 12, _rowc);
                    _mm512_storeu_ps(outptr + 16 * 13, _rowd);
                    _mm512_storeu_ps(outptr + 16 * 14, _rowe);
                    _mm512_storeu_ps(outptr + 16 * 15, _rowf);

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    ptr3 += 16;
                    ptr4 += 16;
                    ptr5 += 16;
                    ptr6 += 16;
                    ptr7 += 16;
                    ptr8 += 16;
                    ptr9 += 16;
                    ptra += 16;
                    ptrb += 16;
                    ptrc += 16;
                    ptrd += 16;
                    ptre += 16;
                    ptrf += 16;
                    outptr += 256;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;
                    outptr[8] = *ptr8++;
                    outptr[9] = *ptr9++;
                    outptr[10] = *ptra++;
                    outptr[11] = *ptrb++;
                    outptr[12] = *ptrc++;
                    outptr[13] = *ptrd++;
                    outptr[14] = *ptre++;
                    outptr[15] = *ptrf++;

                    outptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < top_blob.h; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + outw * (i * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + outw * (i * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + outw * (i * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + outw * (i * 8 + 7);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 7 < outw; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < top_blob.h; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 4 + 3);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (ndim == 3 || ndim == 4)
    {
        if (ndim == 3)
        {
            if (outw == 0)
                outw = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (outh == 0)
                outh = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (outc == 0)
                outc = dims == 3 ? bottom_blob.c * elempack : bottom_blob.c;

            if (outw == -1)
                outw = total / outc / outh;
            if (outh == -1)
                outh = total / outc / outw;
            if (outc == -1)
                outc = total / outh / outw;

            outd = 1;
        }
        else // if (ndim == 4)
        {
            if (outw == 0)
                outw = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (outh == 0)
                outh = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (outd == 0)
                outd = bottom_blob.d;
            if (outc == 0)
                outc = (dims == 3 || dims == 4) ? bottom_blob.c * elempack : bottom_blob.c;

            if (outw == -1)
                outw = total / outc / outd / outh;
            if (outh == -1)
                outh = total / outc / outd / outw;
            if (outd == -1)
                outd = total / outc / outh / outw;
            if (outc == -1)
                outc = total / outd / outh / outw;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if ((dims == 3 || dims == 4) && bottom_blob.c * elempack == outc && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            top_blob.dims = ndim;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.d = outd;
            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        if (ndim == 3)
        {
            top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        else // if (ndim == 4)
        {
            top_blob.create(outw, outh, outd, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        if (top_blob.empty())
            return -100;

        int size = top_blob.w * top_blob.h * top_blob.d;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 16;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 16 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 16 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 16 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + size * (q * 16 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + size * (q * 16 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + size * (q * 16 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + size * (q * 16 + 7);
                const float* ptr8 = (const float*)bottom_blob_flattened + size * (q * 16 + 8);
                const float* ptr9 = (const float*)bottom_blob_flattened + size * (q * 16 + 9);
                const float* ptra = (const float*)bottom_blob_flattened + size * (q * 16 + 10);
                const float* ptrb = (const float*)bottom_blob_flattened + size * (q * 16 + 11);
                const float* ptrc = (const float*)bottom_blob_flattened + size * (q * 16 + 12);
                const float* ptrd = (const float*)bottom_blob_flattened + size * (q * 16 + 13);
                const float* ptre = (const float*)bottom_blob_flattened + size * (q * 16 + 14);
                const float* ptrf = (const float*)bottom_blob_flattened + size * (q * 16 + 15);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 15 < size; i += 16)
                {
                    __m512 _row0 = _mm512_loadu_ps(ptr0);
                    __m512 _row1 = _mm512_loadu_ps(ptr1);
                    __m512 _row2 = _mm512_loadu_ps(ptr2);
                    __m512 _row3 = _mm512_loadu_ps(ptr3);
                    __m512 _row4 = _mm512_loadu_ps(ptr4);
                    __m512 _row5 = _mm512_loadu_ps(ptr5);
                    __m512 _row6 = _mm512_loadu_ps(ptr6);
                    __m512 _row7 = _mm512_loadu_ps(ptr7);
                    __m512 _row8 = _mm512_loadu_ps(ptr8);
                    __m512 _row9 = _mm512_loadu_ps(ptr9);
                    __m512 _rowa = _mm512_loadu_ps(ptra);
                    __m512 _rowb = _mm512_loadu_ps(ptrb);
                    __m512 _rowc = _mm512_loadu_ps(ptrc);
                    __m512 _rowd = _mm512_loadu_ps(ptrd);
                    __m512 _rowe = _mm512_loadu_ps(ptre);
                    __m512 _rowf = _mm512_loadu_ps(ptrf);

                    transpose16x16_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7, _row8, _row9, _rowa, _rowb, _rowc, _rowd, _rowe, _rowf);

                    _mm512_storeu_ps(outptr, _row0);
                    _mm512_storeu_ps(outptr + 16, _row1);
                    _mm512_storeu_ps(outptr + 16 * 2, _row2);
                    _mm512_storeu_ps(outptr + 16 * 3, _row3);
                    _mm512_storeu_ps(outptr + 16 * 4, _row4);
                    _mm512_storeu_ps(outptr + 16 * 5, _row5);
                    _mm512_storeu_ps(outptr + 16 * 6, _row6);
                    _mm512_storeu_ps(outptr + 16 * 7, _row7);
                    _mm512_storeu_ps(outptr + 16 * 8, _row8);
                    _mm512_storeu_ps(outptr + 16 * 9, _row9);
                    _mm512_storeu_ps(outptr + 16 * 10, _rowa);
                    _mm512_storeu_ps(outptr + 16 * 11, _rowb);
                    _mm512_storeu_ps(outptr + 16 * 12, _rowc);
                    _mm512_storeu_ps(outptr + 16 * 13, _rowd);
                    _mm512_storeu_ps(outptr + 16 * 14, _rowe);
                    _mm512_storeu_ps(outptr + 16 * 15, _rowf);

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    ptr3 += 16;
                    ptr4 += 16;
                    ptr5 += 16;
                    ptr6 += 16;
                    ptr7 += 16;
                    ptr8 += 16;
                    ptr9 += 16;
                    ptra += 16;
                    ptrb += 16;
                    ptrc += 16;
                    ptrd += 16;
                    ptre += 16;
                    ptrf += 16;
                    outptr += 256;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;
                    outptr[8] = *ptr8++;
                    outptr[9] = *ptr9++;
                    outptr[10] = *ptra++;
                    outptr[11] = *ptrb++;
                    outptr[12] = *ptrc++;
                    outptr[13] = *ptrd++;
                    outptr[14] = *ptre++;
                    outptr[15] = *ptrf++;

                    outptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + size * (q * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + size * (q * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + size * (q * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + size * (q * 8 + 7);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 4 + 3);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr = (const float*)bottom_blob_flattened + size * q;
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i + 3 < size; i += 4)
                {
                    __m128 _v = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(outptr, _v);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}